

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__time_step
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  time_step__AttributeData *ptVar2;
  StringHash SVar3;
  undefined8 *puVar4;
  long *in_RSI;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  time_step__AttributeData *attributeData;
  ParserChar *in_stack_00000098;
  ParserChar *in_stack_000000a0;
  StringHash in_stack_000000a8;
  ErrorType in_stack_000000b0;
  Severity in_stack_000000b4;
  ParserTemplateBase *in_stack_000000b8;
  void **in_stack_ffffffffffffffb8;
  ParserTemplateBase *in_stack_ffffffffffffffc0;
  undefined8 *local_38;
  bool local_1;
  
  ptVar2 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::time_step__AttributeData>
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_38 = (undefined8 *)*in_RSI;
  if (local_38 == (undefined8 *)0x0) {
LAB_00878a2f:
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        if ((ParserChar *)*local_38 == (ParserChar *)0x0) goto LAB_00878a2f;
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)*local_38);
        puVar4 = local_38 + 1;
        if (puVar4 == (undefined8 *)0x0) {
          return false;
        }
        local_38 = local_38 + 2;
        if (SVar3 != 0x79f4) break;
        ptVar2->sid = (ParserChar *)*puVar4;
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000a8,
                         in_stack_000000a0,in_stack_00000098);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__time_step( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__time_step( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

time_step__AttributeData* attributeData = newData<time_step__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_sid:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_TIME_STEP,
            HASH_ATTRIBUTE_sid,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_TIME_STEP, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}